

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_SingleStringFollowedByCr_Test::~LineSplitter_SingleStringFollowedByCr_Test
          (LineSplitter_SingleStringFollowedByCr_Test *this)

{
  LineSplitter_SingleStringFollowedByCr_Test *this_local;
  
  ~LineSplitter_SingleStringFollowedByCr_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (LineSplitter, SingleStringFollowedByCr) {
    using namespace pstore::dump;

    array::container container;
    std::string const str = "hello";

    line_splitter ls (&container);
    ls.append (pstore::gsl::make_span (str));
    char const cr[1] = {'\n'};
    ls.append (pstore::gsl::span<char const, 1U>{cr});

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello");
}